

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O1

bool __thiscall
CppJieba::MPSegment::_calcDAG
          (MPSegment *this,const_iterator begin,const_iterator end,SegmentContext *segContext)

{
  pointer pSVar1;
  mapped_type pTVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_> *pvVar5;
  bool bVar6;
  mapped_type *ppTVar7;
  __node_base_ptr p_Var8;
  ulong uVar9;
  Trie *this_00;
  pointer ppVar10;
  __node_base_ptr p_Var11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  const_iterator begin_00;
  vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
  vp;
  uint nextp;
  vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
  local_b8;
  vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_> *local_a0;
  Trie *local_98;
  unsigned_short *local_90;
  unsigned_short *local_88;
  undefined1 local_80 [32];
  size_type sStack_60;
  float local_58;
  size_t local_50;
  __node_base_ptr p_Stack_48;
  TrieNodeInfo *local_40;
  double dStack_38;
  
  if (begin._M_current < end._M_current) {
    local_b8.
    super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = &this->_trie;
    begin_00._M_current = begin._M_current;
    local_a0 = segContext;
    local_98 = this_00;
    local_90 = begin._M_current;
    local_88 = end._M_current;
    do {
      pvVar5 = local_a0;
      local_80._0_2_ = *begin_00._M_current;
      local_80._8_8_ = &p_Stack_48;
      local_80._16_8_ = 1;
      local_80._24_8_ = (_Hash_node_base *)0x0;
      sStack_60 = 0;
      local_58 = 1.0;
      local_40 = (TrieNodeInfo *)0x0;
      dStack_38 = 0.0;
      local_50 = 0;
      p_Stack_48 = (__node_base_ptr)0x0;
      std::vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>::
      emplace_back<CppJieba::SegmentChar>(local_a0,(SegmentChar *)local_80);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(local_80 + 8));
      if (local_b8.
          super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_b8.
          super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_b8.
        super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_b8.
             super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      pSVar1 = (pvVar5->
               super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      bVar6 = Trie::find(this_00,begin_00,end,&local_b8);
      uVar14 = (ulong)((long)begin_00._M_current - (long)begin._M_current) >> 1;
      uVar13 = (uint)uVar14;
      if ((bVar6) &&
         (local_b8.
          super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_b8.
          super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        uVar9 = 0;
        uVar12 = 1;
        do {
          local_80._0_4_ =
               local_b8.
               super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9].first + uVar13;
          pTVar2 = local_b8.
                   super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9].second;
          ppTVar7 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&pSVar1[-1].dag,(key_type *)local_80);
          *ppTVar7 = pTVar2;
          bVar6 = uVar12 < (ulong)((long)local_b8.
                                         super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_b8.
                                         super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4);
          uVar9 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (bVar6);
      }
      end._M_current = local_88;
      begin._M_current = local_90;
      this_00 = local_98;
      uVar9 = pSVar1[-1].dag._M_h._M_bucket_count;
      uVar14 = (uVar14 & 0xffffffff) % uVar9;
      p_Var3 = pSVar1[-1].dag._M_h._M_buckets[uVar14];
      p_Var8 = (__node_base_ptr)0x0;
      if ((p_Var3 != (__node_base_ptr)0x0) &&
         (p_Var8 = p_Var3, p_Var11 = p_Var3->_M_nxt, *(uint *)&p_Var3->_M_nxt[1]._M_nxt != uVar13))
      {
        while (p_Var4 = p_Var11->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
          p_Var8 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar9 != uVar14) ||
             (p_Var8 = p_Var11, p_Var11 = p_Var4, *(uint *)&p_Var4[1]._M_nxt == uVar13))
          goto LAB_001109e8;
        }
        p_Var8 = (__node_base_ptr)0x0;
      }
LAB_001109e8:
      if ((p_Var8 == (__node_base_ptr)0x0) || (p_Var8->_M_nxt == (_Hash_node_base *)0x0)) {
        local_80._0_4_ = uVar13;
        ppTVar7 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pSVar1[-1].dag,(key_type *)local_80);
        *ppTVar7 = (mapped_type)0x0;
      }
      begin_00._M_current = begin_00._M_current + 1;
    } while (begin_00._M_current != end._M_current);
    ppVar10 = local_b8.
              super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_b8.
        super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00110a89;
  }
  else {
    local_80._0_8_ = (pointer)(local_80 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"begin >= end.","");
    Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x92,(string *)local_80);
    ppVar10 = (pointer)local_80._0_8_;
    if ((pointer)local_80._0_8_ == (pointer)(local_80 + 0x10)) goto LAB_00110a89;
  }
  operator_delete(ppVar10);
LAB_00110a89:
  return begin._M_current < end._M_current;
}

Assistant:

bool _calcDAG(Unicode::const_iterator begin, Unicode::const_iterator end, SegmentContext& segContext) const
            {
                if(begin >= end)
                {
                    LogError("begin >= end.");
                    return false;
                }

                vector<pair<uint, const TrieNodeInfo*> > vp;
                for(Unicode::const_iterator it = begin; it != end; it++)
                {
                    segContext.push_back(SegmentChar(*it));
                    SegmentChar& back = segContext.back();
                    int i = it - begin;
                    vp.clear();
                    if(_trie.find(it, end, vp))
                    {
                        for(uint j = 0; j < vp.size(); j++)
                        {
                            uint nextp = vp[j].first + i;
                            back.dag[nextp] = vp[j].second; 
                        }
                    }
                    if(back.dag.end() == back.dag.find(i))
                    {
                        back.dag[i] = NULL;
                    }
                }
                return true;
            }